

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ReporterRegistrar<Catch::CompactReporter>::ReporterRegistrar
          (ReporterRegistrar<Catch::CompactReporter> *this,string *name)

{
  ReporterFactory *this_00;
  undefined8 *puVar1;
  undefined8 in_RSI;
  IReporterFactory *p;
  IReporterFactory local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  this_00 = (ReporterFactory *)getMutableRegistryHub();
  puVar1 = (undefined8 *)operator_new(0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  ReporterFactory::ReporterFactory(this_00);
  p = &local_18;
  Ptr<Catch::IReporterFactory>::Ptr((Ptr<Catch::IReporterFactory> *)this_00,p);
  (*(this_00->super_SharedImpl<Catch::IReporterFactory>).super_IReporterFactory.super_IShared.
    super_NonCopyable._vptr_NonCopyable[2])(this_00,local_10,p);
  Ptr<Catch::IReporterFactory>::~Ptr((Ptr<Catch::IReporterFactory> *)this_00);
  return;
}

Assistant:

ReporterRegistrar( std::string const& name ) {
            getMutableRegistryHub().registerReporter( name, new ReporterFactory() );
        }